

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob-filter.c++
# Opt level: O0

void __thiscall kj::GlobFilter::applyState(GlobFilter *this,char c,int state)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  int local_20;
  int local_1c;
  int local_18;
  char local_11;
  int state_local;
  char c_local;
  GlobFilter *this_local;
  
  local_18 = state;
  local_11 = c;
  _state_local = this;
  sVar2 = String::size(&this->pattern);
  if ((ulong)(long)state < sVar2) {
    pcVar3 = String::operator[](&this->pattern,(long)local_18);
    cVar1 = local_11;
    if (*pcVar3 == '*') {
      if ((local_11 != '/') && (local_11 != '\\')) {
        Vector<unsigned_int>::add<int&>(&this->states,&local_18);
      }
      applyState(this,local_11,local_18 + 1);
    }
    else if (*pcVar3 == '?') {
      if ((local_11 != '/') && (local_11 != '\\')) {
        local_1c = local_18 + 1;
        Vector<unsigned_int>::add<int>(&this->states,&local_1c);
      }
    }
    else {
      pcVar3 = String::operator[](&this->pattern,(long)local_18);
      if (cVar1 == *pcVar3) {
        local_20 = local_18 + 1;
        Vector<unsigned_int>::add<int>(&this->states,&local_20);
      }
    }
  }
  return;
}

Assistant:

void GlobFilter::applyState(char c, int state) {
  if (state < pattern.size()) {
    switch (pattern[state]) {
      case '*':
        // At a '*', we both re-add the current state and attempt to match the *next* state.
        if (c != '/' && c != '\\') {  // '*' doesn't match '/'.
          states.add(state);
        }
        applyState(c, state + 1);
        break;

      case '?':
        // A '?' matches one character (never a '/').
        if (c != '/' && c != '\\') {
          states.add(state + 1);
        }
        break;

      default:
        // Any other character matches only itself.
        if (c == pattern[state]) {
          states.add(state + 1);
        }
        break;
    }
  }
}